

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O0

void ImGui::StartMouseMovingWindowOrNode
               (ImGuiWindow *window,ImGuiDockNode *node,bool undock_floating_node)

{
  bool bVar1;
  ImGuiContext *pIVar2;
  bool bVar3;
  byte bVar4;
  byte in_DL;
  ImGuiDockNode *in_RSI;
  ImGuiWindow *in_RDI;
  ImVec2 IVar5;
  ImGuiContext *unaff_retaddr;
  bool dragging;
  bool clicked;
  ImGuiDockNode *root_node;
  bool can_undock_node;
  ImGuiContext *g;
  undefined4 in_stack_ffffffffffffffb8;
  float in_stack_ffffffffffffffbc;
  ImGuiMouseButton in_stack_ffffffffffffffc0;
  undefined1 in_stack_ffffffffffffffcf;
  ImGuiWindow *in_stack_ffffffffffffffd0;
  
  pIVar2 = GImGui;
  bVar1 = false;
  if ((((in_RSI != (ImGuiDockNode *)0x0) && (in_RSI->VisibleWindow != (ImGuiWindow *)0x0)) &&
      ((in_RSI->VisibleWindow->Flags & 4U) == 0)) &&
     (((in_stack_ffffffffffffffd0 = (ImGuiWindow *)DockNodeGetRootNode(in_RSI),
       *(ImGuiDockNode **)&(in_stack_ffffffffffffffd0->ScrollMax).y != in_RSI ||
       (*(ImGuiDockNode **)&(in_stack_ffffffffffffffd0->Scroll).y != (ImGuiDockNode *)0x0)) &&
      (((in_DL & 1) != 0 ||
       (bVar3 = ImGuiDockNode::IsDockSpace((ImGuiDockNode *)in_stack_ffffffffffffffd0), bVar3))))))
  {
    bVar1 = true;
  }
  bVar4 = IsMouseClicked((ImGuiMouseButton)in_stack_ffffffffffffffd0,(bool)in_stack_ffffffffffffffcf
                        );
  bVar3 = IsMouseDragging(in_stack_ffffffffffffffc0,in_stack_ffffffffffffffbc);
  if ((bVar1) && (bVar3)) {
    DockContextQueueUndockNode(unaff_retaddr,(ImGuiDockNode *)in_RDI);
    IVar5 = ::operator-((ImVec2 *)CONCAT44(in_stack_ffffffffffffffbc,in_stack_ffffffffffffffb8),
                        (ImVec2 *)0x1a91bb);
    pIVar2->ActiveIdClickOffset = IVar5;
  }
  else if ((!bVar1) && ((((bVar4 & 1) != 0 || (bVar3)) && (pIVar2->MovingWindow != in_RDI)))) {
    StartMouseMovingWindow(in_stack_ffffffffffffffd0);
    IVar5 = ::operator-((ImVec2 *)CONCAT44(in_stack_ffffffffffffffbc,in_stack_ffffffffffffffb8),
                        (ImVec2 *)0x1a9227);
    pIVar2->ActiveIdClickOffset = IVar5;
  }
  return;
}

Assistant:

void ImGui::StartMouseMovingWindowOrNode(ImGuiWindow* window, ImGuiDockNode* node, bool undock_floating_node)
{
    ImGuiContext& g = *GImGui;
    bool can_undock_node = false;
    if (node != NULL && node->VisibleWindow && (node->VisibleWindow->Flags & ImGuiWindowFlags_NoMove) == 0)
    {
        // Can undock if:
        // - part of a floating node hierarchy with more than one visible node (if only one is visible, we'll just move the whole hierarchy)
        // - part of a dockspace node hierarchy (trivia: undocking from a fixed/central node will create a new node and copy windows)
        ImGuiDockNode* root_node = DockNodeGetRootNode(node);
        if (root_node->OnlyNodeWithWindows != node || root_node->CentralNode != NULL)
            if (undock_floating_node || root_node->IsDockSpace())
                can_undock_node = true;
    }

    const bool clicked = IsMouseClicked(0);
    const bool dragging = IsMouseDragging(0, g.IO.MouseDragThreshold * 1.70f);
    if (can_undock_node && dragging)
    {
        DockContextQueueUndockNode(&g, node);
        g.ActiveIdClickOffset = g.IO.MouseClickedPos[0] - node->Pos;
    }
    else if (!can_undock_node && (clicked || dragging) && g.MovingWindow != window)
    {
        StartMouseMovingWindow(window);
        g.ActiveIdClickOffset = g.IO.MouseClickedPos[0] - window->RootWindow->Pos;
    }
}